

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O0

int mbedtls_aesni_setkey_enc(uchar *rk,uchar *key,size_t bits)

{
  size_t bits_local;
  uchar *key_local;
  uchar *rk_local;
  
  if (bits == 0x80) {
    aesni_setkey_enc_128(rk,key);
  }
  else if (bits == 0xc0) {
    aesni_setkey_enc_192(rk,key);
  }
  else {
    if (bits != 0x100) {
      return -0x20;
    }
    aesni_setkey_enc_256(rk,key);
  }
  return 0;
}

Assistant:

int mbedtls_aesni_setkey_enc( unsigned char *rk,
                      const unsigned char *key,
                      size_t bits )
{
    switch( bits )
    {
        case 128: aesni_setkey_enc_128( rk, key ); break;
        case 192: aesni_setkey_enc_192( rk, key ); break;
        case 256: aesni_setkey_enc_256( rk, key ); break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

    return( 0 );
}